

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O1

vector<char8_t,_std::allocator<char8_t>_> * __thiscall
RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_>::get_remainder
          (vector<char8_t,_std::allocator<char8_t>_> *__return_storage_ptr__,
          RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_> *this,
          size_t in_times_split)

{
  ulong uVar1;
  
  (__return_storage_ptr__->super__Vector_base<char8_t,_std::allocator<char8_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char8_t,_std::allocator<char8_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char8_t,_std::allocator<char8_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = ((long)(this->m_tokens).
                 super__Vector_base<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_tokens).
                 super__Vector_base<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (in_times_split <= uVar1 && uVar1 - in_times_split != 0) {
    std::vector<char8_t,std::allocator<char8_t>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char8_t*,std::vector<char8_t,std::allocator<char8_t>>>>
              ((vector<char8_t,std::allocator<char8_t>> *)__return_storage_ptr__,
               (__return_storage_ptr__->super__Vector_base<char8_t,_std::allocator<char8_t>_>).
               _M_impl.super__Vector_impl_data._M_finish,
               (this->m_str).super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
               super__Vector_impl_data._M_start +
               (this->m_token_indexes).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[in_times_split],
               (this->m_str).super__Vector_base<char8_t,_std::allocator<char8_t>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

StringT get_remainder(size_t in_times_split) {
		StringT result;
		if (in_times_split < m_tokens.size()) {
			auto index = m_token_indexes[in_times_split];
			result.insert(result.end(), m_str.begin() + index, m_str.end());
		}

		return result;
	}